

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionsTests.cpp
# Opt level: O0

void anon_unknown.dwarf_d4ed7::checkSameType(type_info *type1,type_info *type2,string *message)

{
  code *pcVar1;
  byte extraout_AL;
  type_info *in_RSI;
  type_info *in_RDI;
  double __x;
  ResultBuilder DOCTEST_RB;
  ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_core_OptionsTests_cpp:18:9)>
  DOCTEST_CAPTURE_4;
  anon_class_8_1_bc4532e7_for_lambda_ *in_stack_fffffffffffffe38;
  Result *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  String *in_stack_fffffffffffffe50;
  allocator<char> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> local_161;
  string local_160 [8];
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  Enum in_stack_fffffffffffffecc;
  ResultBuilder *in_stack_fffffffffffffed0;
  String *in_stack_fffffffffffffee0;
  undefined1 local_e0 [208];
  type_info *local_10;
  type_info *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  doctest::detail::
  MakeContextScope<(anonymous_namespace)::checkSameType(std::type_info_const&,std::type_info_const&,std::__cxx11::string_const&)::__0>
            (in_stack_fffffffffffffe38);
  doctest::String::String
            (in_stack_fffffffffffffe50,
             (char *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  res = (Result *)local_e0;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(char *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             in_stack_fffffffffffffee0);
  doctest::String::~String((String *)in_stack_fffffffffffffe40);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffffec4,DT_CHECK);
  std::type_info::name(local_8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  doctest::detail::ExpressionDecomposer::operator<<
            ((ExpressionDecomposer *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             in_stack_fffffffffffffe40);
  std::type_info::name(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  doctest::detail::Expression_lhs<std::__cxx11::string>::operator==
            ((Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffe40,res);
  doctest::detail::Result::~Result((Result *)0x17eba1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
  doctest::detail::
  Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Expression_lhs((Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x17ebc2);
  std::__cxx11::string::~string(local_160);
  __x = (double)std::allocator<char>::~allocator(&local_161);
  doctest::detail::ResultBuilder::log((ResultBuilder *)(local_e0 + 0x18),__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffe40);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17ed78);
    doctest::detail::
    ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/core/OptionsTests.cpp:18:9)>
    ::~ContextScope((ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_core_OptionsTests_cpp:18:9)>
                     *)in_stack_fffffffffffffe40);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void checkSameType(std::type_info const& type1,
                       std::type_info const& type2,
                       const std::string& message)
    {
        CHECK_MESSAGE(std::string(type1.name()) == std::string(type2.name()), message);
    }